

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingInputStreamAdaptor::BackUp(CopyingInputStreamAdaptor *this,int count)

{
  pointer puVar1;
  LogMessage *this_00;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  LogMessage *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  LogLevel level;
  LogMessage *in_stack_fffffffffffffee0;
  undefined1 local_d8 [63];
  byte local_99;
  byte local_49;
  int local_c;
  
  level = (LogLevel)((ulong)in_stack_fffffffffffffed8 >> 0x20);
  local_49 = 0;
  local_c = in_ESI;
  if ((*(int *)(in_RDI + 0x30) != 0) ||
     (puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                         ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
                          in_stack_fffffffffffffed0), puVar1 == (pointer)0x0)) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,level,(char *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc);
    local_49 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffed0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x5cd733);
  }
  local_99 = 0;
  if (*(int *)(in_RDI + 0x2c) < local_c) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,level,(char *)in_stack_fffffffffffffed0,
               in_stack_fffffffffffffecc);
    local_99 = 1;
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffed0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x5cd7da);
  }
  if (local_c < 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffee0,(LogLevel)((ulong)local_d8 >> 0x20),
               (char *)in_stack_fffffffffffffed0,in_stack_fffffffffffffecc);
    internal::LogMessage::operator<<
              (in_stack_fffffffffffffed0,
               (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    this_00 = internal::LogMessage::operator<<
                        (in_stack_fffffffffffffed0,
                         (char *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogFinisher::operator=
              ((LogFinisher *)this_00,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    internal::LogMessage::~LogMessage((LogMessage *)0x5cd868);
  }
  *(int *)(in_RDI + 0x30) = local_c;
  return;
}

Assistant:

void CopyingInputStreamAdaptor::BackUp(int count) {
  GOOGLE_CHECK(backup_bytes_ == 0 && buffer_.get() != NULL)
      << " BackUp() can only be called after Next().";
  GOOGLE_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";
  GOOGLE_CHECK_GE(count, 0) << " Parameter to BackUp() can't be negative.";

  backup_bytes_ = count;
}